

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  BYTE *pBVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined2 *puVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  BIT_DStream_status BVar11;
  size_t sVar12;
  long *plVar13;
  long lVar14;
  long *plVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  long *plVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  byte *srcBuffer;
  long *plVar25;
  ulong uVar26;
  ulong uVar27;
  long *plVar28;
  uint uVar29;
  long *plVar30;
  long *plVar31;
  int iVar32;
  ulong *puVar33;
  ulong uVar34;
  ushort *puVar35;
  bool bVar36;
  U64 bits [4];
  BYTE *ip [4];
  HUF_DecompressFastArgs args;
  BIT_DStream_t local_258;
  long *local_230;
  undefined1 local_228 [16];
  ulong *local_218;
  ulong *puStack_210;
  ulong *local_208;
  undefined1 local_1f8 [16];
  long *local_1e8;
  long *plStack_1e0;
  long *local_1d8;
  long *local_1d0;
  ulong local_1c8;
  long *local_1c0;
  long *local_1b8;
  size_t local_1b0;
  long *local_1a8;
  ulong *local_1a0;
  uint local_194;
  long *local_190;
  HUF_DecompressFastArgs local_188;
  ulong *local_e8;
  ulong local_e0;
  ulong local_d8;
  int local_cc;
  ushort *local_c8;
  long *local_c0;
  long *local_b8;
  BYTE *local_b0;
  ushort *local_a8;
  ushort *local_a0;
  long *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong local_80;
  BYTE *local_78;
  ulong local_70;
  ulong local_68;
  BYTE *local_60;
  BYTE *local_58 [5];
  
  local_1b0 = dstSize;
  if ((flags & 0x20U) == 0) {
    local_1b8 = (long *)dst;
    local_1a0 = (ulong *)cSrc;
    local_190 = (long *)cSrcSize;
    sVar12 = HUF_DecompressFastArgs_init(&local_188,dst,dstSize,cSrc,cSrcSize,DTable);
    if (sVar12 - 1 < 0xffffffffffffff88) {
      if (local_188.ip[0] < local_188.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x658,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      puVar35 = (ushort *)((long)local_1a0 + 6);
      plVar13 = (long *)(local_1b0 + (long)local_1b8);
      local_258.bitContainer = local_188.bits[0];
      local_258._8_8_ = local_188.bits[1];
      local_258.ptr = (char *)local_188.bits[2];
      local_258.start = (char *)local_188.bits[3];
      local_228._0_8_ = local_188.ip[0];
      local_228._8_8_ = local_188.ip[1];
      local_218 = (ulong *)local_188.ip[2];
      puStack_210 = (ulong *)local_188.ip[3];
      local_1f8._0_8_ = local_188.op[0];
      local_1f8._8_8_ = local_188.op[1];
      local_1e8 = (long *)local_188.op[2];
      plStack_1e0 = (long *)local_188.op[3];
      local_58[0] = local_188.op[1];
      local_58[1] = local_188.op[2];
      local_58[2] = local_188.op[3];
      local_58[3] = local_188.oend;
      while( true ) {
        lVar14 = 0;
        do {
          plStack_1e0 = (long *)local_188.op[3];
          local_1d0 = plVar13;
          if (local_58[lVar14] < *(BYTE **)(local_1f8 + lVar14 * 8)) {
            __assert_fail("op[stream] <= oend[stream]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x5da,
                          "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          if (*(ushort **)(local_228 + lVar14 * 8) < local_188.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x5db,
                          "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        lVar14 = 0;
        uVar24 = (ulong)(local_228._0_8_ - (long)local_188.ilimit) / 7;
        do {
          uVar18 = (ulong)((long)local_58[lVar14] - *(long *)(local_1f8 + lVar14 * 8)) / 10;
          if (uVar24 < uVar18) {
            uVar18 = uVar24;
          }
          lVar14 = lVar14 + 1;
          uVar24 = uVar18;
        } while (lVar14 != 4);
        if ((((uVar18 < 2) || ((ulong)local_228._8_8_ < (ulong)local_228._0_8_)) ||
            (local_218 < (ulong)local_228._8_8_)) || (puStack_210 < local_218)) break;
        plVar15 = (long *)((long)local_188.op[3] + uVar18 * 5);
        iVar19 = 0;
        do {
          do {
            lVar14 = 0;
            do {
              uVar24 = (&local_258.bitContainer)[lVar14];
              uVar18 = uVar24 >> 0x35;
              bVar16 = *(byte *)((long)local_188.dt + uVar18 * 4 + 2);
              bVar2 = *(byte *)((long)local_188.dt + uVar18 * 4 + 3);
              puVar6 = *(undefined2 **)(local_1f8 + lVar14 * 8);
              *puVar6 = *(undefined2 *)((long)local_188.dt + uVar18 * 4);
              (&local_258.bitContainer)[lVar14] = uVar24 << (bVar16 & 0x3f);
              *(ulong *)(local_1f8 + lVar14 * 8) = (ulong)bVar2 + (long)puVar6;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            iVar19 = iVar19 + 1;
          } while (iVar19 != 5);
          uVar24 = (ulong)local_258.start >> 0x35;
          bVar16 = *(byte *)((long)local_188.dt + uVar24 * 4 + 3);
          local_258.start =
               (char *)((long)local_258.start <<
                       (*(byte *)((long)local_188.dt + uVar24 * 4 + 2) & 0x3f));
          *(undefined2 *)plStack_1e0 = *(undefined2 *)((long)local_188.dt + uVar24 * 4);
          local_188.op[3] = (BYTE *)((ulong)bVar16 + (long)plStack_1e0);
          lVar14 = 0;
          do {
            uVar24 = (ulong)local_258.start >> 0x35;
            bVar16 = *(byte *)((long)local_188.dt + uVar24 * 4 + 2);
            bVar2 = *(byte *)((long)local_188.dt + uVar24 * 4 + 3);
            *(undefined2 *)local_188.op[3] = *(undefined2 *)((long)local_188.dt + uVar24 * 4);
            local_258.start = (char *)((long)local_258.start << (bVar16 & 0x3f));
            uVar24 = (&local_258.bitContainer)[lVar14];
            if (uVar24 == 0) {
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                            ,0x5c,"unsigned int ZSTD_countTrailingZeros64(U64)");
            }
            uVar18 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            puVar33 = (ulong *)(*(long *)(local_228 + lVar14 * 8) - (uVar18 >> 3 & 0x1fffffff));
            *(ulong **)(local_228 + lVar14 * 8) = puVar33;
            local_188.op[3] = (BYTE *)((long)local_188.op[3] + (ulong)bVar2);
            (&local_258.bitContainer)[lVar14] = (*puVar33 | 1) << ((byte)uVar18 & 7);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          plStack_1e0 = (long *)local_188.op[3];
          iVar19 = 0;
        } while (local_188.op[3] < plVar15);
      }
      local_188.bits[2] = (U64)local_258.ptr;
      local_188.bits[3] = (U64)local_258.start;
      local_188.bits[0] = local_258.bitContainer;
      local_188.bits[1] = local_258._8_8_;
      local_188.ip[0] = (BYTE *)local_228._0_8_;
      local_188.ip[1] = (BYTE *)local_228._8_8_;
      local_188.ip[2] = (BYTE *)local_218;
      local_188.ip[3] = (BYTE *)puStack_210;
      local_188.op[2] = (BYTE *)local_1e8;
      local_188.op[0] = (BYTE *)local_1f8._0_8_;
      local_188.op[1] = (BYTE *)local_1f8._8_8_;
      if ((ulong)local_228._0_8_ < puVar35) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65c,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if ((ulong)local_228._8_8_ < puVar35) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65d,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_218 < puVar35) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65e,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_210 < puVar35) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65f,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (plVar13 < local_188.op[3]) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x660,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar24 = local_1b0 + 3 >> 2;
      lVar14 = 0;
      plVar15 = local_1b8;
      local_1c8 = uVar24;
LAB_006ee281:
      uVar18 = (long)plVar13 - (long)plVar15;
      plVar15 = (long *)((long)plVar15 + uVar24);
      if (uVar18 < uVar24) {
        plVar15 = plVar13;
      }
      sVar12 = HUF_initRemainingDStream(&local_258,&local_188,(int)lVar14,(BYTE *)plVar15);
      if (0xffffffffffffff88 < sVar12) {
        return sVar12;
      }
      plVar25 = (long *)local_188.op[lVar14];
      uVar18 = (long)plVar15 - (long)plVar25;
      iVar19 = (int)local_258.start;
      plVar21 = plVar25;
      if (7 < uVar18) {
        if (local_258.bitsConsumed < 0x41) {
          do {
            if (local_258.ptr < local_258.limitPtr) {
              if (local_258.ptr == local_258.start) goto LAB_006ee474;
              bVar36 = local_258.start <=
                       (U64 *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
              uVar17 = (int)local_258.ptr - iVar19;
              if (bVar36) {
                uVar17 = local_258.bitsConsumed >> 3;
              }
              local_258.bitsConsumed = local_258.bitsConsumed + uVar17 * -8;
            }
            else {
              uVar17 = local_258.bitsConsumed >> 3;
              local_258.bitsConsumed = local_258.bitsConsumed & 7;
              bVar36 = true;
            }
            local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar17);
            local_258.bitContainer = *(size_t *)local_258.ptr;
            if (((long *)((long)plVar15 - 9U) <= plVar21) || (!bVar36)) goto LAB_006ee474;
            uVar24 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> 0x35;
            *(short *)plVar21 = (short)DTable[uVar24 + 1];
            iVar10 = *(byte *)((long)DTable + uVar24 * 4 + 6) + local_258.bitsConsumed;
            uVar27 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
            uVar24 = (local_258.bitContainer << ((byte)iVar10 & 0x3f)) >> 0x35;
            *(short *)((long)plVar21 + uVar27) = (short)DTable[uVar24 + 1];
            iVar10 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar10;
            uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
            lVar8 = uVar24 + uVar27;
            uVar18 = (local_258.bitContainer << ((byte)iVar10 & 0x3f)) >> 0x35;
            *(short *)((long)plVar21 + uVar24 + uVar27) = (short)DTable[uVar18 + 1];
            iVar10 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar10;
            uVar24 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
            lVar9 = uVar24 + lVar8;
            uVar18 = (local_258.bitContainer << ((byte)iVar10 & 0x3f)) >> 0x35;
            *(short *)((long)plVar21 + uVar24 + lVar8) = (short)DTable[uVar18 + 1];
            iVar10 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar10;
            uVar24 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
            uVar18 = (local_258.bitContainer << ((byte)iVar10 & 0x3f)) >> 0x35;
            *(short *)((long)plVar21 + uVar24 + lVar9) = (short)DTable[uVar18 + 1];
            local_258.bitsConsumed = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar10;
            plVar21 = (long *)((long)plVar21 +
                              (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar9);
            if (0x40 < local_258.bitsConsumed) goto LAB_006ee474;
          } while( true );
        }
        goto LAB_006ee47f;
      }
      uVar17 = local_258.bitsConsumed;
      if (local_258.bitsConsumed < 0x41) {
        if (local_258.ptr < local_258.limitPtr) {
          if (local_258.ptr == local_258.start) goto LAB_006ee4b9;
          uVar17 = (int)local_258.ptr - iVar19;
          if (local_258.start <= (U64 *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3))
             ) {
            uVar17 = local_258.bitsConsumed >> 3;
          }
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar17);
          uVar17 = local_258.bitsConsumed + uVar17 * -8;
        }
        else {
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
          uVar17 = local_258.bitsConsumed & 7;
        }
        local_258.bitsConsumed = uVar17;
        local_258.bitContainer = *(U64 *)local_258.ptr;
      }
      goto LAB_006ee4b9;
    }
LAB_006ee5ee:
    cSrc = local_1a0;
    dst = local_1b8;
    cSrcSize = (size_t)local_190;
    if (sVar12 != 0) {
      return sVar12;
    }
  }
  if (cSrcSize < (long *)0xa) {
    return 0xffffffffffffffec;
  }
  uVar3 = *cSrc;
  uVar24 = (ulong)uVar3;
  uVar4 = *(ushort *)((long)cSrc + 2);
  uVar5 = *(ushort *)((long)cSrc + 4);
  plVar13 = (long *)(uVar24 + uVar4 + (ulong)uVar5 + 6);
  if (local_1b0 < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < plVar13) {
    return 0xffffffffffffffec;
  }
  local_230 = (long *)((long)dst + local_1b0);
  uVar18 = local_1b0 + 3 >> 2;
  local_1a8 = (long *)((long)dst + uVar18);
  plVar15 = (long *)((long)local_1a8 + uVar18);
  plVar25 = (long *)(uVar18 + (long)plVar15);
  if (local_230 < plVar25) {
    return 0xffffffffffffffec;
  }
  if (uVar3 == 0) {
    return 0xffffffffffffffb8;
  }
  local_188.ip[3] = (BYTE *)((long)cSrc + 6);
  local_258.start = (char *)((long)cSrc + uVar24 + 6);
  uVar17 = *DTable;
  local_188.op[0] = (BYTE *)((long)cSrc + 0xe);
  if (uVar3 < 8) {
    local_188.ip[0] = (BYTE *)(ulong)(byte)*(ushort *)local_188.ip[3];
    switch(uVar3) {
    case 2:
      goto LAB_006ee79d;
    case 3:
      goto LAB_006ee792;
    case 4:
      break;
    case 7:
      local_188.ip[0] =
           (BYTE *)((ulong)local_188.ip[0] | (ulong)(byte)*(ushort *)((long)cSrc + 0xc) << 0x30);
    case 6:
      local_188.ip[0] =
           (BYTE *)((long)local_188.ip[0] + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28));
    case 5:
      local_188.ip[0] =
           (BYTE *)((long)local_188.ip[0] + ((ulong)(byte)*(ushort *)((long)cSrc + 10) << 0x20));
      break;
    default:
      goto switchD_006ee746_default;
    }
    local_188.ip[0] =
         (BYTE *)((long)local_188.ip[0] + (ulong)*(byte *)((long)cSrc + 9) * 0x200000 * 8);
LAB_006ee792:
    local_188.ip[0] =
         (BYTE *)((long)local_188.ip[0] + (ulong)(byte)*(ushort *)((long)cSrc + 8) * 0x2000 * 8);
LAB_006ee79d:
    local_188.ip[0] = (BYTE *)((long)local_188.ip[0] + (ulong)*(byte *)((long)cSrc + 7) * 0x20 * 8);
switchD_006ee746_default:
    bVar16 = *(byte *)((long)cSrc + uVar24 + 5);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar23 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    local_1c8._0_4_ = (uVar23 ^ 0x1f) + (uint)uVar3 * -8 + 0x29;
    puVar35 = (ushort *)local_188.ip[3];
  }
  else {
    local_188.ip[0] = *(BYTE **)((long)cSrc + (uVar24 - 2));
    if ((ulong)local_188.ip[0] >> 0x38 == 0) {
      return 0xffffffffffffffff;
    }
    uVar23 = 0x1f;
    bVar16 = (byte)((ulong)local_188.ip[0] >> 0x38);
    if (bVar16 != 0) {
      for (; bVar16 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    local_1c8._0_4_ = ~uVar23 + 9;
    puVar35 = (ushort *)((long)cSrc + (uVar24 - 2));
  }
  local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,(uint)local_1c8);
  if (uVar4 == 0) {
    return 0xffffffffffffffb8;
  }
  puStack_210 = (ulong *)((ulong)uVar4 + (long)local_258.start);
  local_258.limitPtr = (char *)((long)cSrc + uVar24 + 0xe);
  if (uVar4 < 8) {
    local_258.bitContainer = (size_t)(byte)*(ulong *)local_258.start;
    switch(uVar4) {
    case 7:
      local_258.bitContainer =
           local_258.bitContainer | (ulong)*(byte *)((long)cSrc + uVar24 + 0xc) << 0x30;
    case 6:
      local_258.bitContainer =
           local_258.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar24 + 0xb) << 0x28);
    case 5:
      local_258.bitContainer =
           local_258.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar24 + 10) << 0x20);
    case 4:
      local_258.bitContainer =
           local_258.bitContainer + (ulong)*(byte *)((long)cSrc + uVar24 + 9) * 0x1000000;
    case 3:
      local_258.bitContainer =
           local_258.bitContainer + (ulong)*(byte *)((long)cSrc + uVar24 + 8) * 0x10000;
    case 2:
      local_258.bitContainer =
           local_258.bitContainer + (ulong)*(byte *)((long)cSrc + uVar24 + 7) * 0x100;
    }
    bVar16 = *(byte *)((long)puStack_210 + -1);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar23 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    uVar23 = (uVar23 ^ 0x1f) + (uint)uVar4 * -8 + 0x29;
    local_258.ptr = local_258.start;
  }
  else {
    local_258.bitContainer = puStack_210[-1];
    if (local_258.bitContainer >> 0x38 == 0) {
      return 0xffffffffffffffff;
    }
    uVar23 = 0x1f;
    bVar16 = (byte)(local_258.bitContainer >> 0x38);
    if (bVar16 != 0) {
      for (; bVar16 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    uVar23 = ~uVar23 + 9;
    local_258.ptr = (char *)(puStack_210 + -1);
  }
  local_258.bitsConsumed = uVar23;
  if (uVar5 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar5 + (long)puStack_210);
  local_208 = puStack_210 + 1;
  if (uVar5 < 8) {
    local_228._0_8_ = ZEXT18((byte)*puStack_210);
    switch(uVar5) {
    case 7:
      local_228._0_8_ = local_228._0_8_ | (ulong)*(byte *)((long)puStack_210 + 6) << 0x30;
    case 6:
      local_228._0_8_ = local_228._0_8_ + ((ulong)*(byte *)((long)puStack_210 + 5) << 0x28);
    case 5:
      local_228._0_8_ = local_228._0_8_ + ((ulong)*(byte *)((long)puStack_210 + 4) << 0x20);
    case 4:
      local_228._0_8_ = local_228._0_8_ + (ulong)*(byte *)((long)puStack_210 + 3) * 0x1000000;
    case 3:
      local_228._0_8_ = local_228._0_8_ + (ulong)*(byte *)((long)puStack_210 + 2) * 0x10000;
    case 2:
      local_228._0_8_ = local_228._0_8_ + (ulong)*(byte *)((long)puStack_210 + 1) * 0x100;
    }
    bVar16 = srcBuffer[-1];
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar22 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar22 == 0; uVar22 = uVar22 - 1) {
      }
    }
    uVar22 = (uVar22 ^ 0x1f) + (uint)uVar5 * -8 + 0x29;
    local_1a0 = puStack_210;
  }
  else {
    local_1a0 = (ulong *)(srcBuffer + -8);
    local_228._0_8_ = *(undefined8 *)(srcBuffer + -8);
    if ((ulong)local_228._0_8_ >> 0x38 == 0) {
      return 0xffffffffffffffff;
    }
    uVar22 = 0x1f;
    bVar16 = (byte)((ulong)local_228._0_8_ >> 0x38);
    if (bVar16 != 0) {
      for (; bVar16 >> uVar22 == 0; uVar22 = uVar22 - 1) {
      }
    }
    uVar22 = ~uVar22 + 9;
  }
  local_228._8_4_ = uVar22;
  local_218 = local_1a0;
  local_1d0 = (long *)local_188.ip[0];
  local_1b8 = (long *)dst;
  local_188.ip[2] = (BYTE *)puVar35;
  local_e8 = (ulong *)local_258.ptr;
  local_e0 = local_228._0_8_;
  local_d8 = local_258.bitContainer;
  local_c8 = (ushort *)local_188.ip[3];
  local_a0 = (ushort *)local_188.op[0];
  local_90 = local_208;
  local_88 = (ulong *)local_258.limitPtr;
  sVar12 = BIT_initDStream((BIT_DStream_t *)local_1f8,srcBuffer,cSrcSize - (long)plVar13);
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  local_c0 = (long *)((long)local_1b8 + (local_1b0 - 7));
  uVar20 = uVar17 >> 0x10 & 0xff;
  cVar7 = (char)(uVar17 >> 0x10);
  plVar13 = plVar15;
  plVar21 = plVar25;
  plVar31 = local_1a8;
  plVar30 = local_1b8;
  local_1c0 = plVar15;
  if (plVar25 < local_c0 && 7 < (ulong)((long)local_230 - (long)plVar25)) {
    local_a8 = puVar35;
    if (uVar20 == 0) goto LAB_006f0af7;
    bVar16 = -cVar7 & 0x3f;
    local_98 = local_1d8;
    local_b8 = local_1e8;
    local_b0 = (BYTE *)local_1f8._0_8_;
    uVar17 = local_1f8._8_4_;
    local_190 = plVar15;
    do {
      uVar24 = (ulong)((long)local_1d0 << ((byte)(uint)local_1c8 & 0x3f)) >> bVar16;
      *(short *)plVar30 = (short)DTable[uVar24 + 1];
      iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + (uint)local_1c8;
      uVar18 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar24 = (ulong)((long)local_1d0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar30 + uVar18) = (short)DTable[uVar24 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
      uVar27 = (ulong)((long)local_1d0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      local_60 = (BYTE *)((long)plVar30 + uVar24 + uVar18);
      *(short *)((long)plVar30 + uVar24 + uVar18) = (short)DTable[uVar27 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
      uVar34 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
      uVar24 = (ulong)((long)local_1d0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)(local_60 + uVar34) = (short)DTable[uVar24 + 1];
      uVar18 = (local_d8 << ((byte)uVar23 & 0x3f)) >> bVar16;
      uVar29 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
      plVar30 = (long *)(ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      *(short *)plVar31 = (short)DTable[uVar18 + 1];
      iVar19 = *(byte *)((long)DTable + uVar18 * 4 + 6) + uVar23;
      uVar18 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
      uVar24 = (local_d8 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar31 + uVar18) = (short)DTable[uVar24 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar26 = (local_d8 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar31 + uVar24 + uVar18) = (short)DTable[uVar26 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar19;
      uVar27 = (local_d8 << ((byte)iVar19 & 0x3f)) >> bVar16;
      pBVar1 = (BYTE *)((long)plVar31 + uVar24 + uVar18);
      local_68 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      *(short *)(pBVar1 + local_68) = (short)DTable[uVar27 + 1];
      bVar2 = *(byte *)((long)DTable + uVar27 * 4 + 7);
      iVar10 = 3;
      plVar13 = local_190;
      if (local_a8 < local_a0) {
        local_cc = 3;
      }
      else {
        if (0x40 < uVar29) goto LAB_006f0ad8;
        local_a8 = (ushort *)((long)local_a8 - (ulong)(uVar29 >> 3));
        uVar29 = uVar29 & 7;
        local_1d0 = *(long **)local_a8;
        local_cc = 0;
        local_188.ip[0] = (BYTE *)local_1d0;
        local_188.ip[2] = (BYTE *)local_a8;
      }
      uVar23 = iVar19 + (uint)*(byte *)((long)DTable + uVar27 * 4 + 6);
      local_1b8 = plVar30;
      local_78 = pBVar1;
      local_70 = uVar34;
      local_1c8._0_4_ = uVar29;
      if (local_88 <= local_e8) {
        if (0x40 < uVar23) goto LAB_006f0ad8;
        local_258.ptr = (char *)((long)local_e8 - (ulong)(uVar23 >> 3));
        local_258.bitContainer = *(size_t *)local_258.ptr;
        iVar10 = 0;
        uVar23 = uVar23 & 7;
        local_e8 = (ulong *)local_258.ptr;
        local_d8 = local_258.bitContainer;
      }
      local_194 = uVar23;
      uVar24 = (local_e0 << ((byte)uVar22 & 0x3f)) >> bVar16;
      *(short *)local_190 = (short)DTable[uVar24 + 1];
      iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + uVar22;
      uVar27 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar24 = (local_e0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)local_190 + uVar27) = (short)DTable[uVar24 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
      uVar18 = (local_e0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      lVar14 = uVar24 + uVar27;
      *(short *)((long)local_190 + uVar24 + uVar27) = (short)DTable[uVar18 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      local_80 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
      uVar24 = (local_e0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)local_190 + local_80 + lVar14) = (short)DTable[uVar24 + 1];
      uVar22 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
      local_228._8_4_ = uVar22;
      plVar13 = (long *)(ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar24 = (ulong)((long)local_b0 << ((byte)uVar17 & 0x3f)) >> bVar16;
      *(short *)plVar21 = (short)DTable[uVar24 + 1];
      iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + uVar17;
      uVar18 = (ulong)((long)local_b0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      *(short *)((long)plVar21 + uVar24) = (short)DTable[uVar18 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      uVar27 = (ulong)((long)local_b0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar18 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
      *(short *)((long)plVar21 + uVar18 + uVar24) = (short)DTable[uVar27 + 1];
      lVar8 = uVar18 + uVar24;
      iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
      uVar18 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
      uVar24 = (ulong)((long)local_b0 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar21 + uVar18 + lVar8) = (short)DTable[uVar24 + 1];
      uVar23 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
      local_1f8._8_4_ = uVar23;
      iVar19 = 3;
      if (local_1a0 < local_90) {
        iVar32 = 3;
      }
      else {
        if (0x40 < uVar22) goto LAB_006f0ad8;
        local_218 = (ulong *)((long)local_1a0 - (ulong)(uVar22 >> 3));
        local_228._8_8_ = CONCAT44(local_228._12_4_,uVar22) & 0xffffffff00000007;
        local_228._0_8_ = *local_218;
        iVar32 = 0;
        uVar22 = uVar22 & 7;
        local_1a0 = local_218;
        local_e0 = local_228._0_8_;
      }
      uVar17 = uVar23;
      if (local_1d8 <= local_b8) {
        if (0x40 < uVar23) {
LAB_006f0ad8:
          local_190 = plVar13;
          __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                        ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
        }
        local_1e8 = (long *)((long)local_b8 - (ulong)(uVar23 >> 3));
        uVar17 = uVar23 & 7;
        local_1f8._8_8_ = CONCAT44(local_1f8._12_4_,uVar23) & 0xffffffff00000007;
        local_1f8._0_8_ = *local_1e8;
        iVar19 = 0;
        local_b8 = local_1e8;
        local_b0 = (BYTE *)local_1f8._0_8_;
      }
      plVar30 = (long *)((long)plVar30 + (long)(local_60 + uVar34));
      plVar31 = (long *)(pBVar1 + bVar2 + local_68);
      local_190 = (long *)((long)plVar13 + (long)((long)local_190 + local_80 + lVar14));
      plVar21 = (long *)((long)plVar21 +
                        (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7) + uVar18 + lVar8);
    } while ((plVar21 < local_c0) &&
            (uVar23 = local_194, ((iVar10 == 0 && local_cc == 0) && iVar32 == 0) && iVar19 == 0));
    local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,uVar29);
    local_258.bitsConsumed = local_194;
    plVar13 = local_190;
  }
  if ((local_1a8 < plVar30) || (plVar15 < plVar31)) {
    return 0xffffffffffffffec;
  }
  if (plVar25 < plVar13) {
    return 0xffffffffffffffec;
  }
  plVar28 = local_230;
  local_1d0 = plVar31;
  if ((ulong)((long)local_1a8 - (long)plVar30) < 8) {
    if ((uint)local_1c8 < 0x41) {
      if (local_188.ip[2] < local_a0) {
        if ((ushort *)local_188.ip[2] != local_c8) {
          uVar17 = (int)local_188.ip[2] - (int)local_c8;
          if (local_c8 <= (ushort *)((long)local_188.ip[2] - (ulong)((uint)local_1c8 >> 3))) {
            uVar17 = (uint)local_1c8 >> 3;
          }
          local_188.ip[2] = (BYTE *)((long)local_188.ip[2] - (ulong)uVar17);
          local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,(uint)local_1c8 + uVar17 * -8);
          local_188.ip[0] = *(BYTE **)local_188.ip[2];
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)&local_188);
        plVar28 = local_230;
      }
    }
  }
  else if (uVar20 < 0xc) {
    if ((uint)local_1c8 < 0x41) {
      plVar31 = (long *)((long)local_1a8 - 9);
      bVar16 = -cVar7 & 0x3f;
      do {
        if (local_188.ip[2] < local_188.op[0]) {
          if (local_188.ip[2] == local_188.ip[3]) break;
          bVar36 = (ushort *)((long)local_188.ip[2] - (ulong)((uint)local_1c8 >> 3)) <
                   local_188.ip[3];
          uVar17 = (int)local_188.ip[2] - (int)local_188.ip[3];
          if (!bVar36) {
            uVar17 = (uint)local_1c8 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_188.ip[2] = (BYTE *)((long)local_188.ip[2] - (ulong)uVar17);
          local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,(uint)local_1c8 + uVar17 * -8);
          local_188.ip[0] = *(BYTE **)local_188.ip[2];
        }
        else {
          BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)&local_188);
          plVar28 = local_230;
          plVar15 = local_1c0;
        }
        if ((plVar31 <= plVar30) || (BVar11 != BIT_DStream_unfinished)) break;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (ulong)((long)local_188.ip[0] << ((byte)local_188.ip[1] & 0x3f)) >> bVar16;
        *(short *)plVar30 = (short)DTable[uVar24 + 1];
        iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + (uint)local_188.ip[1];
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar30 + uVar24) = (short)DTable[uVar18 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
        uVar27 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> bVar16;
        lVar14 = uVar18 + uVar24;
        *(short *)((long)plVar30 + uVar18 + uVar24) = (short)DTable[uVar27 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
        uVar24 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> bVar16;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
        lVar8 = uVar18 + lVar14;
        *(short *)((long)plVar30 + uVar18 + lVar14) = (short)DTable[uVar24 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar30 + uVar24 + lVar8) = (short)DTable[uVar18 + 1];
        local_1c8._0_4_ = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,(uint)local_1c8);
        plVar30 = (long *)((long)plVar30 +
                          (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar8);
        if (0x40 < (uint)local_1c8) break;
      } while( true );
    }
  }
  else if ((uint)local_1c8 < 0x41) {
    plVar31 = (long *)((long)local_1a8 - 7);
    bVar16 = -cVar7 & 0x3f;
    do {
      if (local_188.ip[2] < local_188.op[0]) {
        plVar28 = local_230;
        plVar15 = local_1c0;
        if (local_188.ip[2] == local_188.ip[3]) break;
        bVar36 = (ushort *)((long)local_188.ip[2] - (ulong)((uint)local_1c8 >> 3)) < local_188.ip[3]
        ;
        uVar17 = (int)local_188.ip[2] - (int)local_188.ip[3];
        if (!bVar36) {
          uVar17 = (uint)local_1c8 >> 3;
        }
        BVar11 = (BIT_DStream_status)bVar36;
        local_188.ip[2] = (BYTE *)((long)local_188.ip[2] - (ulong)uVar17);
        local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,(uint)local_1c8 + uVar17 * -8);
        local_188.ip[0] = *(BYTE **)local_188.ip[2];
      }
      else {
        BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)&local_188);
      }
      plVar28 = local_230;
      plVar15 = local_1c0;
      if ((plVar31 <= plVar30) || (BVar11 != BIT_DStream_unfinished)) break;
      uVar24 = (ulong)((long)local_188.ip[0] << ((byte)local_188.ip[1] & 0x3f)) >> bVar16;
      *(short *)plVar30 = (short)DTable[uVar24 + 1];
      iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + (uint)local_188.ip[1];
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar27 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar30 + uVar24) = (short)DTable[uVar27 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
      uVar18 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar27 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
      lVar14 = uVar27 + uVar24;
      *(short *)((long)plVar30 + uVar27 + uVar24) = (short)DTable[uVar18 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
      uVar18 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar30 + uVar24 + lVar14) = (short)DTable[uVar18 + 1];
      local_1c8._0_4_ = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,(uint)local_1c8);
      plVar30 = (long *)((long)plVar30 +
                        (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar14);
      if (0x40 < (uint)local_1c8) break;
    } while( true );
  }
  if (1 < (ulong)((long)local_1a8 - (long)plVar30)) {
    plVar31 = (long *)((long)local_1a8 - 2);
    if ((uint)local_188.ip[1] < 0x41) {
      uVar17 = (uint)local_188.ip[1];
      do {
        if (local_188.ip[2] < local_188.op[0]) {
          if (local_188.ip[2] == local_188.ip[3]) goto LAB_006ef6e7;
          bVar36 = (ushort *)((long)local_188.ip[2] - (ulong)(uVar17 >> 3)) < local_188.ip[3];
          uVar23 = (int)local_188.ip[2] - (int)local_188.ip[3];
          if (!bVar36) {
            uVar23 = uVar17 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_188.ip[2] = (BYTE *)((long)local_188.ip[2] - (ulong)uVar23);
          local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,uVar17 + uVar23 * -8);
          local_188.ip[0] = *(BYTE **)local_188.ip[2];
        }
        else {
          BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)&local_188);
          plVar28 = local_230;
          plVar15 = local_1c0;
        }
        if ((plVar31 < plVar30) || (BVar11 != BIT_DStream_unfinished)) goto LAB_006ef6e7;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (ulong)((long)local_188.ip[0] << ((byte)local_188.ip[1] & 0x3f)) >>
                 (-cVar7 & 0x3fU);
        *(short *)plVar30 = (short)DTable[uVar24 + 1];
        uVar17 = *(byte *)((long)DTable + uVar24 * 4 + 6) + (uint)local_188.ip[1];
        local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,uVar17);
        plVar30 = (long *)((long)plVar30 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
      } while (uVar17 < 0x41);
      if (plVar30 <= plVar31) goto LAB_006ef6f7;
    }
    else {
LAB_006ef6e7:
      if (plVar30 <= plVar31) {
        if (uVar20 == 0) goto LAB_006f0af7;
LAB_006ef6f7:
        iVar19 = (uint)local_188.ip[1];
        do {
          uVar24 = (ulong)((long)local_188.ip[0] << ((byte)iVar19 & 0x3f)) >> (-cVar7 & 0x3fU);
          *(short *)plVar30 = (short)DTable[uVar24 + 1];
          iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + (uint)local_188.ip[1];
          local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,iVar19);
          plVar30 = (long *)((long)plVar30 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
        } while (plVar30 <= plVar31);
      }
    }
  }
  if (plVar30 < local_1a8) {
    if (uVar20 == 0) goto LAB_006f0af7;
    uVar24 = (ulong)((long)local_188.ip[0] << ((byte)local_188.ip[1] & 0x3f)) >> (-cVar7 & 0x3fU);
    *(BYTE *)plVar30 = (BYTE)DTable[uVar24 + 1];
    if (*(char *)((long)DTable + uVar24 * 4 + 7) == '\x01') {
      uVar17 = *(byte *)((long)DTable + uVar24 * 4 + 6) + (uint)local_188.ip[1];
    }
    else {
      if (0x3f < (uint)local_188.ip[1]) goto LAB_006ef7ab;
      uVar23 = (uint)local_188.ip[1] + *(byte *)((long)DTable + uVar24 * 4 + 6);
      uVar17 = 0x40;
      if (uVar23 < 0x40) {
        uVar17 = uVar23;
      }
    }
    local_188.ip[1] = (BYTE *)CONCAT44(local_188.ip[1]._4_4_,uVar17);
  }
LAB_006ef7ab:
  plVar31 = local_1d0;
  if ((ulong)((long)plVar15 - (long)local_1d0) < 8) {
    if (local_258.bitsConsumed < 0x41) {
      if (local_258.ptr < local_258.limitPtr) {
        if (local_258.ptr != local_258.start) {
          uVar17 = (int)local_258.ptr - (int)local_258.start;
          if (local_258.start <=
              (ulong *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3))) {
            uVar17 = local_258.bitsConsumed >> 3;
          }
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar17);
          local_258.bitsConsumed = local_258.bitsConsumed + uVar17 * -8;
          local_258.bitContainer = *(size_t *)local_258.ptr;
        }
      }
      else {
        BIT_reloadDStreamFast(&local_258);
        plVar31 = local_1d0;
        plVar28 = local_230;
      }
    }
  }
  else if (uVar20 < 0xc) {
    if (local_258.bitsConsumed < 0x41) {
      bVar16 = -cVar7 & 0x3f;
      uVar17 = local_258.bitsConsumed;
      do {
        if (local_258.ptr < local_258.limitPtr) {
          if (local_258.ptr == local_258.start) break;
          bVar36 = (ulong *)((long)local_258.ptr - (ulong)(uVar17 >> 3)) < local_258.start;
          uVar23 = (int)local_258.ptr - (int)local_258.start;
          if (!bVar36) {
            uVar23 = uVar17 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar23);
          local_258.bitsConsumed = uVar17 + uVar23 * -8;
          local_258.bitContainer = *(size_t *)local_258.ptr;
        }
        else {
          BVar11 = BIT_reloadDStreamFast(&local_258);
          plVar28 = local_230;
        }
        if (((long *)((long)plVar15 - 9U) <= plVar31) || (BVar11 != BIT_DStream_unfinished)) break;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> bVar16;
        *(short *)plVar31 = (short)DTable[uVar24 + 1];
        iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + local_258.bitsConsumed;
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (local_258.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar31 + uVar24) = (short)DTable[uVar18 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
        uVar27 = (local_258.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        lVar14 = uVar18 + uVar24;
        *(short *)((long)plVar31 + uVar18 + uVar24) = (short)DTable[uVar27 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
        uVar24 = (local_258.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
        lVar8 = uVar18 + lVar14;
        *(short *)((long)plVar31 + uVar18 + lVar14) = (short)DTable[uVar24 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (local_258.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar31 + uVar24 + lVar8) = (short)DTable[uVar18 + 1];
        uVar17 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        local_258.bitsConsumed = uVar17;
        plVar31 = (long *)((long)plVar31 +
                          (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar8);
        if (0x40 < uVar17) break;
      } while( true );
    }
  }
  else if (local_258.bitsConsumed < 0x41) {
    bVar16 = -cVar7 & 0x3f;
    uVar17 = local_258.bitsConsumed;
    do {
      if (local_258.ptr < local_258.limitPtr) {
        if (local_258.ptr == local_258.start) break;
        bVar36 = (ulong *)((long)local_258.ptr - (ulong)(uVar17 >> 3)) < local_258.start;
        uVar23 = (int)local_258.ptr - (int)local_258.start;
        if (!bVar36) {
          uVar23 = uVar17 >> 3;
        }
        BVar11 = (BIT_DStream_status)bVar36;
        local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar23);
        local_258.bitsConsumed = uVar17 + uVar23 * -8;
        local_258.bitContainer = *(size_t *)local_258.ptr;
      }
      else {
        BVar11 = BIT_reloadDStreamFast(&local_258);
      }
      plVar28 = local_230;
      if (((long *)((long)plVar15 - 7U) <= plVar31) || (BVar11 != BIT_DStream_unfinished)) break;
      uVar24 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> bVar16;
      *(short *)plVar31 = (short)DTable[uVar24 + 1];
      iVar19 = *(byte *)((long)DTable + uVar24 * 4 + 6) + local_258.bitsConsumed;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar27 = (local_258.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar31 + uVar24) = (short)DTable[uVar27 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
      uVar18 = (local_258.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar27 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
      lVar14 = uVar27 + uVar24;
      *(short *)((long)plVar31 + uVar27 + uVar24) = (short)DTable[uVar18 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
      uVar18 = (local_258.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar31 + uVar24 + lVar14) = (short)DTable[uVar18 + 1];
      uVar17 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      local_258.bitsConsumed = uVar17;
      plVar31 = (long *)((long)plVar31 +
                        (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar14);
      if (0x40 < uVar17) break;
    } while( true );
  }
  if (1 < (ulong)((long)local_1c0 - (long)plVar31)) {
    plVar15 = (long *)((long)local_1c0 - 2);
    if (local_258.bitsConsumed < 0x41) {
      uVar17 = local_258.bitsConsumed;
      do {
        if (local_258.ptr < local_258.limitPtr) {
          if (local_258.ptr == local_258.start) goto LAB_006efcc8;
          bVar36 = (ulong *)((long)local_258.ptr - (ulong)(uVar17 >> 3)) < local_258.start;
          uVar23 = (int)local_258.ptr - (int)local_258.start;
          if (!bVar36) {
            uVar23 = uVar17 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar23);
          local_258.bitsConsumed = uVar17 + uVar23 * -8;
          local_258.bitContainer = *(size_t *)local_258.ptr;
        }
        else {
          BVar11 = BIT_reloadDStreamFast(&local_258);
          plVar28 = local_230;
        }
        if ((plVar15 < plVar31) || (BVar11 != BIT_DStream_unfinished)) goto LAB_006efcc8;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >>
                 (-cVar7 & 0x3fU);
        *(short *)plVar31 = (short)DTable[uVar24 + 1];
        uVar17 = *(byte *)((long)DTable + uVar24 * 4 + 6) + local_258.bitsConsumed;
        local_258.bitsConsumed = uVar17;
        plVar31 = (long *)((long)plVar31 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
      } while (uVar17 < 0x41);
      if (plVar31 <= plVar15) goto LAB_006efcd6;
    }
    else {
LAB_006efcc8:
      if (plVar31 <= plVar15) {
        if (uVar20 == 0) goto LAB_006f0af7;
LAB_006efcd6:
        uVar17 = local_258.bitsConsumed;
        do {
          uVar24 = (local_258.bitContainer << ((byte)uVar17 & 0x3f)) >> (-cVar7 & 0x3fU);
          *(short *)plVar31 = (short)DTable[uVar24 + 1];
          uVar17 = *(byte *)((long)DTable + uVar24 * 4 + 6) + local_258.bitsConsumed;
          local_258.bitsConsumed = uVar17;
          plVar31 = (long *)((long)plVar31 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
        } while (plVar31 <= plVar15);
      }
    }
  }
  if (plVar31 < local_1c0) {
    if (uVar20 == 0) goto LAB_006f0af7;
    uVar24 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> (-cVar7 & 0x3fU);
    *(BYTE *)plVar31 = (BYTE)DTable[uVar24 + 1];
    if (*(char *)((long)DTable + uVar24 * 4 + 7) == '\x01') {
      uVar17 = *(byte *)((long)DTable + uVar24 * 4 + 6) + local_258.bitsConsumed;
    }
    else {
      if (0x3f < local_258.bitsConsumed) goto LAB_006efd68;
      uVar23 = local_258.bitsConsumed + *(byte *)((long)DTable + uVar24 * 4 + 6);
      uVar17 = 0x40;
      if (uVar23 < 0x40) {
        uVar17 = uVar23;
      }
    }
    local_258.bitsConsumed = uVar17;
  }
LAB_006efd68:
  if ((ulong)((long)plVar25 - (long)plVar13) < 8) {
    if ((uint)local_228._8_4_ < 0x41) {
      if (local_218 < local_208) {
        if (local_218 != puStack_210) {
          uVar17 = (int)local_218 - (int)puStack_210;
          if (puStack_210 <= (ulong *)((long)local_218 - (ulong)((uint)local_228._8_4_ >> 3))) {
            uVar17 = (uint)local_228._8_4_ >> 3;
          }
          local_218 = (ulong *)((long)local_218 - (ulong)uVar17);
          local_228._8_4_ = local_228._8_4_ + uVar17 * -8;
          local_228._0_8_ = *local_218;
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)local_228);
        plVar28 = local_230;
      }
    }
  }
  else if (uVar20 < 0xc) {
    if ((uint)local_228._8_4_ < 0x41) {
      bVar16 = -cVar7 & 0x3f;
      uVar17 = local_228._8_4_;
      do {
        if (local_218 < local_208) {
          if (local_218 == puStack_210) break;
          bVar36 = (ulong *)((long)local_218 - (ulong)(uVar17 >> 3)) < puStack_210;
          uVar23 = (int)local_218 - (int)puStack_210;
          if (!bVar36) {
            uVar23 = uVar17 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_218 = (ulong *)((long)local_218 - (ulong)uVar23);
          local_228._8_4_ = uVar17 + uVar23 * -8;
          local_228._0_8_ = *local_218;
        }
        else {
          BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)local_228);
          plVar28 = local_230;
        }
        if (((long *)((long)plVar25 - 9U) <= plVar13) || (BVar11 != BIT_DStream_unfinished)) break;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (ulong)(local_228._0_8_ << ((byte)local_228._8_8_ & 0x3f)) >> bVar16;
        *(short *)plVar13 = (short)DTable[uVar24 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_228._8_4_;
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (ulong)(local_228._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar13 + uVar24) = (short)DTable[uVar18 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
        uVar27 = (ulong)(local_228._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        lVar14 = uVar18 + uVar24;
        *(short *)((long)plVar13 + uVar18 + uVar24) = (short)DTable[uVar27 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
        uVar24 = (ulong)(local_228._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
        lVar8 = uVar18 + lVar14;
        *(short *)((long)plVar13 + uVar18 + lVar14) = (short)DTable[uVar24 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (ulong)(local_228._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar13 + uVar24 + lVar8) = (short)DTable[uVar18 + 1];
        uVar17 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        local_228._8_4_ = uVar17;
        plVar13 = (long *)((long)plVar13 +
                          (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar8);
        if (0x40 < uVar17) break;
      } while( true );
    }
  }
  else if ((uint)local_228._8_4_ < 0x41) {
    bVar16 = -cVar7 & 0x3f;
    uVar17 = local_228._8_4_;
    do {
      if (local_218 < local_208) {
        if (local_218 == puStack_210) break;
        bVar36 = (ulong *)((long)local_218 - (ulong)(uVar17 >> 3)) < puStack_210;
        uVar23 = (int)local_218 - (int)puStack_210;
        if (!bVar36) {
          uVar23 = uVar17 >> 3;
        }
        BVar11 = (BIT_DStream_status)bVar36;
        local_218 = (ulong *)((long)local_218 - (ulong)uVar23);
        local_228._8_4_ = uVar17 + uVar23 * -8;
        local_228._0_8_ = *local_218;
      }
      else {
        BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)local_228);
      }
      plVar28 = local_230;
      if (((long *)((long)plVar25 - 7U) <= plVar13) || (BVar11 != BIT_DStream_unfinished)) break;
      uVar24 = (ulong)(local_228._0_8_ << ((byte)local_228._8_8_ & 0x3f)) >> bVar16;
      *(short *)plVar13 = (short)DTable[uVar24 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_228._8_4_;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar27 = (ulong)(local_228._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar13 + uVar24) = (short)DTable[uVar27 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
      uVar18 = (ulong)(local_228._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar27 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
      lVar14 = uVar27 + uVar24;
      *(short *)((long)plVar13 + uVar27 + uVar24) = (short)DTable[uVar18 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
      uVar18 = (ulong)(local_228._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar13 + uVar24 + lVar14) = (short)DTable[uVar18 + 1];
      uVar17 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      local_228._8_4_ = uVar17;
      plVar13 = (long *)((long)plVar13 +
                        (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar14);
      if (0x40 < uVar17) break;
    } while( true );
  }
  if (1 < (ulong)((long)plVar25 - (long)plVar13)) {
    plVar15 = (long *)((long)plVar25 - 2);
    if ((uint)local_228._8_4_ < 0x41) {
      uVar17 = local_228._8_4_;
      do {
        if (local_218 < local_208) {
          if (local_218 == puStack_210) goto LAB_006f02c8;
          bVar36 = (ulong *)((long)local_218 - (ulong)(uVar17 >> 3)) < puStack_210;
          uVar23 = (int)local_218 - (int)puStack_210;
          if (!bVar36) {
            uVar23 = uVar17 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_218 = (ulong *)((long)local_218 - (ulong)uVar23);
          local_228._8_4_ = uVar17 + uVar23 * -8;
          local_228._0_8_ = *local_218;
        }
        else {
          BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)local_228);
          plVar28 = local_230;
        }
        if ((plVar15 < plVar13) || (BVar11 != BIT_DStream_unfinished)) goto LAB_006f02c8;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (ulong)(local_228._0_8_ << (local_228[8] & 0x3f)) >> (-cVar7 & 0x3fU);
        *(short *)plVar13 = (short)DTable[uVar24 + 1];
        uVar17 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_228._8_4_;
        local_228._8_4_ = uVar17;
        plVar13 = (long *)((long)plVar13 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
      } while (uVar17 < 0x41);
      if (plVar13 <= plVar15) goto LAB_006f02d6;
    }
    else {
LAB_006f02c8:
      if (plVar13 <= plVar15) {
        if (uVar20 == 0) goto LAB_006f0af7;
LAB_006f02d6:
        uVar17 = local_228._8_4_;
        do {
          uVar24 = (ulong)(local_228._0_8_ << ((byte)uVar17 & 0x3f)) >> (-cVar7 & 0x3fU);
          *(short *)plVar13 = (short)DTable[uVar24 + 1];
          uVar17 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_228._8_4_;
          local_228._8_4_ = uVar17;
          plVar13 = (long *)((long)plVar13 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
        } while (plVar13 <= plVar15);
      }
    }
  }
  if (plVar13 < plVar25) {
    if (uVar20 == 0) goto LAB_006f0af7;
    uVar24 = (ulong)(local_228._0_8_ << (local_228[8] & 0x3f)) >> (-cVar7 & 0x3fU);
    *(BYTE *)plVar13 = (BYTE)DTable[uVar24 + 1];
    if (*(char *)((long)DTable + uVar24 * 4 + 7) == '\x01') {
      uVar17 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_228._8_4_;
    }
    else {
      if (0x3f < (uint)local_228._8_4_) goto LAB_006f036a;
      uVar23 = local_228._8_4_ + (uint)*(byte *)((long)DTable + uVar24 * 4 + 6);
      uVar17 = 0x40;
      if (uVar23 < 0x40) {
        uVar17 = uVar23;
      }
    }
    local_228._8_4_ = uVar17;
  }
LAB_006f036a:
  if ((ulong)((long)plVar28 - (long)plVar21) < 8) {
    if ((uint)local_1f8._8_4_ < 0x41) {
      if (local_1e8 < local_1d8) {
        if (local_1e8 != plStack_1e0) {
          uVar17 = (int)local_1e8 - (int)plStack_1e0;
          if (plStack_1e0 <= (long *)((long)local_1e8 - (ulong)((uint)local_1f8._8_4_ >> 3))) {
            uVar17 = (uint)local_1f8._8_4_ >> 3;
          }
          local_1e8 = (long *)((long)local_1e8 - (ulong)uVar17);
          local_1f8._8_4_ = local_1f8._8_4_ + uVar17 * -8;
          local_1f8._0_8_ = *local_1e8;
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)local_1f8);
        plVar28 = local_230;
      }
    }
  }
  else if (uVar20 < 0xc) {
    if ((uint)local_1f8._8_4_ < 0x41) {
      plVar13 = (long *)((long)plVar28 - 9);
      bVar16 = -cVar7 & 0x3f;
      uVar17 = local_1f8._8_4_;
      do {
        if (local_1e8 < local_1d8) {
          if (local_1e8 == plStack_1e0) break;
          bVar36 = (long *)((long)local_1e8 - (ulong)(uVar17 >> 3)) < plStack_1e0;
          uVar23 = (int)local_1e8 - (int)plStack_1e0;
          if (!bVar36) {
            uVar23 = uVar17 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_1e8 = (long *)((long)local_1e8 - (ulong)uVar23);
          local_1f8._8_4_ = uVar17 + uVar23 * -8;
          local_1f8._0_8_ = *local_1e8;
        }
        else {
          BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)local_1f8);
          plVar28 = local_230;
        }
        if ((plVar13 <= plVar21) || (BVar11 != BIT_DStream_unfinished)) break;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (ulong)(local_1f8._0_8_ << ((byte)local_1f8._8_8_ & 0x3f)) >> bVar16;
        *(short *)plVar21 = (short)DTable[uVar24 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_1f8._8_4_;
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (ulong)(local_1f8._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar21 + uVar24) = (short)DTable[uVar18 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
        uVar27 = (ulong)(local_1f8._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        lVar14 = uVar18 + uVar24;
        *(short *)((long)plVar21 + uVar18 + uVar24) = (short)DTable[uVar27 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
        uVar24 = (ulong)(local_1f8._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
        lVar8 = uVar18 + lVar14;
        *(short *)((long)plVar21 + uVar18 + lVar14) = (short)DTable[uVar24 + 1];
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar19;
        uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        uVar18 = (ulong)(local_1f8._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(short *)((long)plVar21 + uVar24 + lVar8) = (short)DTable[uVar18 + 1];
        uVar17 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
        local_1f8._8_4_ = uVar17;
        plVar21 = (long *)((long)plVar21 +
                          (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar8);
        if (0x40 < uVar17) break;
      } while( true );
    }
  }
  else if ((uint)local_1f8._8_4_ < 0x41) {
    bVar16 = -cVar7 & 0x3f;
    uVar17 = local_1f8._8_4_;
    do {
      if (local_1e8 < local_1d8) {
        if (local_1e8 == plStack_1e0) break;
        bVar36 = (long *)((long)local_1e8 - (ulong)(uVar17 >> 3)) < plStack_1e0;
        uVar23 = (int)local_1e8 - (int)plStack_1e0;
        if (!bVar36) {
          uVar23 = uVar17 >> 3;
        }
        BVar11 = (BIT_DStream_status)bVar36;
        local_1e8 = (long *)((long)local_1e8 - (ulong)uVar23);
        local_1f8._8_4_ = uVar17 + uVar23 * -8;
        local_1f8._0_8_ = *local_1e8;
      }
      else {
        BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)local_1f8);
      }
      plVar28 = local_230;
      if ((local_c0 <= plVar21) || (BVar11 != BIT_DStream_unfinished)) break;
      uVar24 = (ulong)(local_1f8._0_8_ << ((byte)local_1f8._8_8_ & 0x3f)) >> bVar16;
      *(short *)plVar21 = (short)DTable[uVar24 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_1f8._8_4_;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar27 = (ulong)(local_1f8._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar21 + uVar24) = (short)DTable[uVar27 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar19;
      uVar18 = (ulong)(local_1f8._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
      uVar27 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
      lVar14 = uVar27 + uVar24;
      *(short *)((long)plVar21 + uVar27 + uVar24) = (short)DTable[uVar18 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
      uVar18 = (ulong)(local_1f8._0_8_ << ((byte)iVar19 & 0x3f)) >> bVar16;
      *(short *)((long)plVar21 + uVar24 + lVar14) = (short)DTable[uVar18 + 1];
      uVar17 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar19;
      local_1f8._8_4_ = uVar17;
      plVar21 = (long *)((long)plVar21 +
                        (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar24 + lVar14);
      if (0x40 < uVar17) break;
    } while( true );
  }
  if (1 < (ulong)((long)plVar28 - (long)plVar21)) {
    plVar13 = (long *)((long)plVar28 - 2);
    if ((uint)local_1f8._8_4_ < 0x41) {
      uVar17 = local_1f8._8_4_;
      do {
        if (local_1e8 < local_1d8) {
          if (local_1e8 == plStack_1e0) goto LAB_006f07d6;
          bVar36 = (long *)((long)local_1e8 - (ulong)(uVar17 >> 3)) < plStack_1e0;
          uVar23 = (int)local_1e8 - (int)plStack_1e0;
          if (!bVar36) {
            uVar23 = uVar17 >> 3;
          }
          BVar11 = (BIT_DStream_status)bVar36;
          local_1e8 = (long *)((long)local_1e8 - (ulong)uVar23);
          local_1f8._8_4_ = uVar17 + uVar23 * -8;
          local_1f8._0_8_ = *local_1e8;
        }
        else {
          BVar11 = BIT_reloadDStreamFast((BIT_DStream_t *)local_1f8);
          plVar28 = local_230;
        }
        if ((plVar13 < plVar21) || (BVar11 != BIT_DStream_unfinished)) goto LAB_006f07d6;
        if (uVar20 == 0) goto LAB_006f0af7;
        uVar24 = (ulong)(local_1f8._0_8_ << (local_1f8[8] & 0x3f)) >> (-cVar7 & 0x3fU);
        *(short *)plVar21 = (short)DTable[uVar24 + 1];
        uVar17 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_1f8._8_4_;
        local_1f8._8_4_ = uVar17;
        plVar21 = (long *)((long)plVar21 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
      } while (uVar17 < 0x41);
      if (plVar21 <= plVar13) goto LAB_006f07e4;
    }
    else {
LAB_006f07d6:
      if (plVar21 <= plVar13) {
        if (uVar20 == 0) goto LAB_006f0af7;
LAB_006f07e4:
        uVar17 = local_1f8._8_4_;
        do {
          uVar24 = (ulong)(local_1f8._0_8_ << ((byte)uVar17 & 0x3f)) >> (-cVar7 & 0x3fU);
          *(short *)plVar21 = (short)DTable[uVar24 + 1];
          uVar17 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + local_1f8._8_4_;
          local_1f8._8_4_ = uVar17;
          plVar21 = (long *)((long)plVar21 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7));
        } while (plVar21 <= plVar13);
      }
    }
  }
  uVar17 = local_1f8._8_4_;
  if (plVar21 < plVar28) {
    if (uVar20 == 0) {
LAB_006f0af7:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    uVar24 = (ulong)(local_1f8._0_8_ << (local_1f8[8] & 0x3f)) >> (-cVar7 & 0x3fU);
    *(BYTE *)plVar21 = (BYTE)DTable[uVar24 + 1];
    if (*(char *)((long)DTable + uVar24 * 4 + 7) == '\x01') {
      uVar17 = *(byte *)((long)DTable + uVar24 * 4 + 6) + uVar17;
    }
    else if ((uVar17 < 0x40) &&
            (uVar17 = uVar17 + *(byte *)((long)DTable + uVar24 * 4 + 6), 0x3f < uVar17)) {
      uVar17 = 0x40;
    }
  }
  if (uVar17 != 0x40) {
    local_1b0 = 0xffffffffffffffec;
  }
  if (local_1e8 != plStack_1e0) {
    local_1b0 = 0xffffffffffffffec;
  }
  if (local_228._8_4_ != 0x40) {
    local_1b0 = 0xffffffffffffffec;
  }
  if (local_218 != puStack_210) {
    local_1b0 = 0xffffffffffffffec;
  }
  if (local_258.bitsConsumed != 0x40) {
    local_1b0 = 0xffffffffffffffec;
  }
  if (local_258.ptr != local_258.start) {
    local_1b0 = 0xffffffffffffffec;
  }
  if ((uint)local_188.ip[1] != 0x40) {
    local_1b0 = 0xffffffffffffffec;
  }
  if (local_188.ip[2] != local_188.ip[3]) {
    return 0xffffffffffffffec;
  }
  return local_1b0;
LAB_006ee474:
  uVar18 = (long)plVar15 - (long)plVar21;
LAB_006ee47f:
  plVar13 = local_1d0;
  uVar24 = local_1c8;
  uVar17 = local_258.bitsConsumed;
LAB_006ee4b9:
  if (1 < uVar18) {
    while (uVar17 < 0x41) {
      if (local_258.ptr < local_258.limitPtr) {
        if (local_258.ptr == local_258.start) break;
        bVar36 = local_258.start <= (U64 *)((long)local_258.ptr - (ulong)(uVar17 >> 3));
        uVar23 = (int)local_258.ptr - iVar19;
        if (bVar36) {
          uVar23 = uVar17 >> 3;
        }
        local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar23);
        uVar17 = uVar17 + uVar23 * -8;
      }
      else {
        local_258.ptr = (char *)((long)local_258.ptr - (ulong)(uVar17 >> 3));
        uVar17 = uVar17 & 7;
        bVar36 = true;
      }
      local_258.bitsConsumed = uVar17;
      local_258.bitContainer = *(U64 *)local_258.ptr;
      if (((long *)((long)plVar15 - 2U) < plVar21) || (!bVar36)) break;
      uVar18 = (*(U64 *)local_258.ptr << ((byte)uVar17 & 0x3f)) >> 0x35;
      *(short *)plVar21 = (short)DTable[uVar18 + 1];
      uVar17 = *(byte *)((long)DTable + uVar18 * 4 + 6) + uVar17;
      local_258.bitsConsumed = uVar17;
      plVar21 = (long *)((long)plVar21 + (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7));
    }
    for (; plVar21 <= (long *)((long)plVar15 - 2U);
        plVar21 = (long *)((long)plVar21 + (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7))) {
      uVar18 = (local_258.bitContainer << ((byte)uVar17 & 0x3f)) >> 0x35;
      *(short *)plVar21 = (short)DTable[uVar18 + 1];
      uVar17 = *(byte *)((long)DTable + uVar18 * 4 + 6) + local_258.bitsConsumed;
      local_258.bitsConsumed = uVar17;
    }
  }
  if (plVar21 < plVar15) {
    *(BYTE *)plVar21 = (BYTE)DTable[((local_258.bitContainer << ((byte)uVar17 & 0x3f)) >> 0x35) + 1]
    ;
    plVar21 = (long *)((long)plVar21 + 1);
  }
  plVar21 = (long *)((long)plVar21 + ((long)local_188.op[lVar14] - (long)plVar25));
  local_188.op[lVar14] = (BYTE *)plVar21;
  if (plVar21 != plVar15) {
    return 0xffffffffffffffec;
  }
  lVar14 = lVar14 + 1;
  sVar12 = local_1b0;
  if (lVar14 == 4) goto LAB_006ee5ee;
  goto LAB_006ee281;
}

Assistant:

static size_t HUF_decompress4X2_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X2_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X2_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X2_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X2_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}